

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::unimposeNeumannBC(MLNodeLaplacian *this,int amrlev,Any *a_rhs)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  Geometry *this_00;
  MFItInfo *this_01;
  FabArray<amrex::FArrayBox> *in_RDI;
  GpuArray<amrex::LinOpBCType,_3U> GVar4;
  Array4<double> *rhsarr;
  Box *bx_1;
  MFIter mfi;
  MFItInfo mfi_info;
  MultiFab *rhs;
  GpuArray<amrex::LinOpBCType,_3U> hibc;
  GpuArray<amrex::LinOpBCType,_3U> lobc;
  Box bx;
  Box *nddom;
  int i;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  undefined4 uVar5;
  MLLinOp *in_stack_fffffffffffffe30;
  MFIter *mfi_00;
  MLLinOp *in_stack_fffffffffffffe40;
  Any *in_stack_fffffffffffffe48;
  MFItInfo *in_stack_fffffffffffffe50;
  FabArrayBase *in_stack_fffffffffffffe58;
  MFIter *in_stack_fffffffffffffe60;
  MFIter *in_stack_fffffffffffffe90;
  MFIter local_150;
  MFItInfo local_ec;
  MultiFab *local_d8;
  LinOpBCType local_d0 [3];
  undefined8 local_bc;
  LinOpBCType local_b4;
  LinOpBCType local_b0 [3];
  undefined8 local_a0;
  LinOpBCType local_98;
  undefined1 local_94 [60];
  Box *local_58;
  int local_4c;
  MFIter *local_48;
  int local_3c;
  undefined1 *local_38;
  undefined4 local_30;
  int local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  int local_14;
  undefined1 *local_10;
  int local_4;
  
  if (in_RDI[3].super_FabArrayBase.n_filled.vect[0] == 1) {
    this_00 = MLLinOp::Geom(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                            in_stack_fffffffffffffe28);
    local_58 = Geometry::Domain(this_00);
    local_94._0_8_ = *(undefined8 *)(local_58->smallend).vect;
    local_94._8_8_ = *(undefined8 *)((local_58->smallend).vect + 2);
    uVar2 = *(undefined8 *)((local_58->bigend).vect + 1);
    uVar1 = (local_58->btype).itype;
    mfi_00 = (MFIter *)local_94;
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      local_38 = local_94 + 0x18;
      local_3c = local_4c;
      local_14 = local_4c;
      local_4 = local_4c;
      if ((uVar1 & 1 << ((byte)local_4c & 0x1f)) == 0) {
        local_28 = local_94 + 0xc;
        local_2c = local_4c;
        local_30 = 1;
        *(int *)(local_28 + (long)local_4c * 4) = *(int *)(local_28 + (long)local_4c * 4) + 1;
      }
      local_10 = local_38;
    }
    local_20 = local_94 + 0x18;
    local_94._24_4_ = 7;
    local_94._28_8_ = local_94;
    uVar5 = 0;
    local_94._16_8_ = uVar2;
    local_48 = mfi_00;
    GVar4 = MLLinOp::LoBC(in_stack_fffffffffffffe40,(int)((ulong)in_RDI >> 0x20));
    local_b0[2] = GVar4.arr[2];
    local_98 = local_b0[2];
    local_b0._0_8_ = GVar4.arr._0_8_;
    local_a0._0_4_ = local_b0[0];
    local_a0._4_4_ = local_b0[1];
    local_b0 = GVar4.arr;
    GVar4 = MLLinOp::HiBC(in_stack_fffffffffffffe40,(int)((ulong)in_RDI >> 0x20));
    local_d0._0_8_ = GVar4.arr._0_8_;
    local_bc._0_4_ = local_d0[0];
    local_bc._4_4_ = local_d0[1];
    local_d0[2] = GVar4.arr[2];
    local_b4 = local_d0[2];
    local_d0 = GVar4.arr;
    local_d8 = Any::get<amrex::MultiFab>(in_stack_fffffffffffffe48);
    MFItInfo::MFItInfo((MFItInfo *)in_stack_fffffffffffffe40);
    this_01 = MFItInfo::EnableTiling(&local_ec,(IntVect *)&FabArrayBase::mfiter_tile_size);
    MFItInfo::SetDynamic(this_01,true);
    MFIter::MFIter(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    while( true ) {
      bVar3 = MFIter::isValid(&local_150);
      if (!bVar3) break;
      MFIter::tilebox(in_stack_fffffffffffffe90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
      mlndlap_unimpose_neumann_bc
                ((Box *)in_stack_fffffffffffffe40,(Array4<double> *)in_RDI,(Box *)mfi_00,
                 (GpuArray<amrex::LinOpBCType,_3U> *)CONCAT44(uVar5,in_stack_fffffffffffffe28),
                 (GpuArray<amrex::LinOpBCType,_3U> *)0x12d3b8e);
      MFIter::operator++(&local_150);
    }
    MFIter::~MFIter(mfi_00);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::unimposeNeumannBC (int amrlev, Any& a_rhs) const
{
    if (m_coarsening_strategy == CoarseningStrategy::RAP) {
        const Box& nddom = amrex::surroundingNodes(Geom(amrlev).Domain());
        const auto lobc = LoBC();
        const auto hibc = HiBC();

        AMREX_ASSERT(a_rhs.is<MultiFab>());
        MultiFab& rhs = a_rhs.get<MultiFab>();

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(rhs,mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& rhsarr = rhs.array(mfi);
            mlndlap_unimpose_neumann_bc(bx, rhsarr, nddom, lobc, hibc);
        }
    }
}